

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void do_cmd_keymaps(char *title,wchar_t row)

{
  undefined1 local_24 [8];
  region loc;
  wchar_t row_local;
  char *title_local;
  
  local_24._0_4_ = 0;
  local_24._4_4_ = 0;
  loc.col = 0;
  loc.row = 0xc;
  loc.width = row;
  unique0x100000cb = title;
  screen_save();
  clear_from(L'\0');
  if (keymap_menu == (menu *)0x0) {
    keymap_menu = menu_new_action(keymap_actions,5);
    keymap_menu->title = stack0xfffffffffffffff0;
    keymap_menu->selections = "abcdefghijklmnopqrstuvwxyz";
    keymap_menu->browse_hook = keymap_browse_hook;
  }
  menu_layout(keymap_menu,(region *)local_24);
  menu_select(keymap_menu,0,false);
  screen_load();
  return;
}

Assistant:

static void do_cmd_keymaps(const char *title, int row)
{
	region loc = {0, 0, 0, 12};

	screen_save();
	clear_from(0);

	if (!keymap_menu) {
		keymap_menu = menu_new_action(keymap_actions,
				N_ELEMENTS(keymap_actions));
	
		keymap_menu->title = title;
		keymap_menu->selections = lower_case;
		keymap_menu->browse_hook = keymap_browse_hook;
	}

	menu_layout(keymap_menu, &loc);
	menu_select(keymap_menu, 0, false);

	screen_load();
}